

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURLcode curl_easy_recv(Curl_easy *data,void *buffer,size_t buflen,size_t *n)

{
  _Bool _Var1;
  CURLcode CVar2;
  curl_socket_t sfd;
  connectdata *c;
  ssize_t n1;
  curl_socket_t local_34;
  connectdata *local_30;
  size_t local_28;
  
  _Var1 = Curl_is_in_callback(data);
  CVar2 = CURLE_RECURSIVE_API_CALL;
  if (!_Var1) {
    CVar2 = easy_connection(data,&local_34,&local_30);
    if (CVar2 == CURLE_OK) {
      if (data->conn == (connectdata *)0x0) {
        Curl_attach_connection(data,local_30);
      }
      *n = 0;
      CVar2 = Curl_read(data,local_34,(char *)buffer,buflen,(ssize_t *)&local_28);
      if (CVar2 == CURLE_OK) {
        *n = local_28;
        CVar2 = CURLE_OK;
      }
    }
  }
  return CVar2;
}

Assistant:

CURLcode curl_easy_recv(struct Curl_easy *data, void *buffer, size_t buflen,
                        size_t *n)
{
  curl_socket_t sfd;
  CURLcode result;
  ssize_t n1;
  struct connectdata *c;

  if(Curl_is_in_callback(data))
    return CURLE_RECURSIVE_API_CALL;

  result = easy_connection(data, &sfd, &c);
  if(result)
    return result;

  if(!data->conn)
    /* on first invoke, the transfer has been detached from the connection and
       needs to be reattached */
    Curl_attach_connection(data, c);

  *n = 0;
  result = Curl_read(data, sfd, buffer, buflen, &n1);

  if(result)
    return result;

  *n = (size_t)n1;

  return CURLE_OK;
}